

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O2

long linux_if_drops(char *if_name)

{
  char cVar1;
  size_t sVar2;
  FILE *__stream;
  char *pcVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  bool bVar7;
  char buffer [512];
  
  sVar2 = strlen(if_name);
  __stream = fopen("/proc/net/dev","r");
  if (__stream == (FILE *)0x0) {
    return 0;
  }
  iVar5 = 3;
  bVar7 = false;
  do {
    while( true ) {
      pcVar3 = fgets(buffer,0x200,__stream);
      if (pcVar3 == (char *)0x0) goto LAB_001187df;
      if ((bVar7) || (pcVar3 = strstr(buffer,"bytes"), pcVar3 == (char *)0x0)) break;
      bVar7 = true;
      iVar5 = 4;
    }
    pcVar3 = strstr(buffer,if_name);
  } while ((pcVar3 == (char *)0x0) ||
          (((pcVar3 != buffer && (pcVar3[-1] != ' ')) || (pcVar3[(int)sVar2] != ':'))));
  pcVar3 = pcVar3 + (long)(int)sVar2 + 1;
  do {
    iVar5 = iVar5 + -1;
    if ((iVar5 == 0) || (cVar1 = *pcVar3, cVar1 == '\0')) {
      for (; *pcVar3 == ' '; pcVar3 = pcVar3 + 1) {
      }
      if (*pcVar3 == '\0') {
LAB_001187df:
        lVar4 = 0;
      }
      else {
        lVar4 = strtol(pcVar3,(char **)0x0,10);
      }
      fclose(__stream);
      return lVar4;
    }
    while ((pcVar6 = pcVar3 + 1, cVar1 != '\0' && (pcVar3 = pcVar6, cVar1 == ' '))) {
      cVar1 = *pcVar6;
    }
    do {
      cVar1 = *pcVar3;
      if (cVar1 == '\0') break;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != ' ');
  } while( true );
}

Assistant:

static long int
linux_if_drops(const char * if_name)
{
	char buffer[512];
	char * bufptr;
	FILE * file;
	int field_to_convert = 3, if_name_sz = strlen(if_name);
	long int dropped_pkts = 0;

	file = fopen("/proc/net/dev", "r");
	if (!file)
		return 0;

	while (!dropped_pkts && fgets( buffer, sizeof(buffer), file ))
	{
		/* 	search for 'bytes' -- if its in there, then
			that means we need to grab the fourth field. otherwise
			grab the third field. */
		if (field_to_convert != 4 && strstr(buffer, "bytes"))
		{
			field_to_convert = 4;
			continue;
		}

		/* find iface and make sure it actually matches -- space before the name and : after it */
		if ((bufptr = strstr(buffer, if_name)) &&
			(bufptr == buffer || *(bufptr-1) == ' ') &&
			*(bufptr + if_name_sz) == ':')
		{
			bufptr = bufptr + if_name_sz + 1;

			/* grab the nth field from it */
			while( --field_to_convert && *bufptr != '\0')
			{
				while (*bufptr != '\0' && *(bufptr++) == ' ');
				while (*bufptr != '\0' && *(bufptr++) != ' ');
			}

			/* get rid of any final spaces */
			while (*bufptr != '\0' && *bufptr == ' ') bufptr++;

			if (*bufptr != '\0')
				dropped_pkts = strtol(bufptr, NULL, 10);

			break;
		}
	}

	fclose(file);
	return dropped_pkts;
}